

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O3

void enet_peer_dispatch_incoming_unreliable_commands(ENetPeer *peer,ENetChannel *channel)

{
  ENetList *pEVar1;
  ENetList *position;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ENetListIterator in_RDX;
  ENetListIterator extraout_RDX;
  ENetListIterator extraout_RDX_00;
  ENetListIterator extraout_RDX_01;
  ENetListIterator extraout_RDX_02;
  ENetListIterator extraout_RDX_03;
  ENetListIterator extraout_RDX_04;
  ENetIncomingCommand *incomingCommand;
  _ENetListNode *p_Var5;
  _ENetListNode *dataFirst;
  ushort uVar6;
  _ENetListNode *startCommand;
  
  pEVar1 = &channel->incomingUnreliableCommands;
  p_Var5 = (channel->incomingUnreliableCommands).sentinel.next;
  startCommand = p_Var5;
  if (p_Var5 != &pEVar1->sentinel) {
    position = &peer->dispatchedCommands;
    dataFirst = p_Var5;
    do {
      if (((ulong)p_Var5[1].next & 0xf00000000) != 0x900000000) {
        uVar2 = *(ushort *)&p_Var5[1].next;
        uVar3 = channel->incomingReliableSequenceNumber;
        if (uVar2 == uVar3) {
          if (*(int *)((long)&p_Var5[4].previous + 4) == 0) {
            channel->incomingUnreliableSequenceNumber = *(enet_uint16 *)((long)&p_Var5[1].next + 2);
            goto LAB_00104c62;
          }
          if (dataFirst == p_Var5) {
            if (startCommand != dataFirst) {
              startCommand = p_Var5->previous;
            }
          }
          else {
            enet_list_move(&position->sentinel,dataFirst,p_Var5->previous);
            in_RDX = extraout_RDX;
            startCommand = p_Var5;
            if (peer->needsDispatch == 0) {
              enet_list_insert(&(peer->host->dispatchQueue).sentinel,peer);
              peer->needsDispatch = 1;
              in_RDX = extraout_RDX_00;
            }
          }
        }
        else {
          uVar4 = uVar2 >> 0xc;
          in_RDX = (ENetListIterator)(ulong)uVar4;
          uVar6 = uVar4 + 0x10;
          if (uVar3 <= uVar2) {
            uVar6 = uVar4;
          }
          if (uVar3 >> 0xc <= uVar6 && uVar6 < (ushort)((uVar3 >> 0xc) + 7)) break;
          startCommand = p_Var5->next;
          if ((dataFirst != p_Var5) &&
             (enet_list_move(&position->sentinel,dataFirst,p_Var5->previous),
             in_RDX = extraout_RDX_01, peer->needsDispatch == 0)) {
            enet_list_insert(&(peer->host->dispatchQueue).sentinel,peer);
            peer->needsDispatch = 1;
            in_RDX = extraout_RDX_02;
          }
        }
        dataFirst = p_Var5->next;
      }
LAB_00104c62:
      p_Var5 = p_Var5->next;
    } while (p_Var5 != &pEVar1->sentinel);
    if ((dataFirst != p_Var5) &&
       (enet_list_move(&position->sentinel,dataFirst,p_Var5->previous), in_RDX = extraout_RDX_03,
       startCommand = p_Var5, peer->needsDispatch == 0)) {
      enet_list_insert(&(peer->host->dispatchQueue).sentinel,peer);
      peer->needsDispatch = 1;
      in_RDX = extraout_RDX_04;
    }
  }
  enet_peer_remove_incoming_commands((ENetList *)(pEVar1->sentinel).next,startCommand,in_RDX);
  return;
}

Assistant:

void
enet_peer_dispatch_incoming_unreliable_commands (ENetPeer * peer, ENetChannel * channel)
{
    ENetListIterator droppedCommand, startCommand, currentCommand;

    for (droppedCommand = startCommand = currentCommand = enet_list_begin (& channel -> incomingUnreliableCommands);
         currentCommand != enet_list_end (& channel -> incomingUnreliableCommands);
         currentCommand = enet_list_next (currentCommand))
    {
       ENetIncomingCommand * incomingCommand = (ENetIncomingCommand *) currentCommand;

       if ((incomingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_MASK) == ENET_PROTOCOL_COMMAND_SEND_UNSEQUENCED)
         continue;

       if (incomingCommand -> reliableSequenceNumber == channel -> incomingReliableSequenceNumber)
       {
          if (incomingCommand -> fragmentsRemaining <= 0)
          {
             channel -> incomingUnreliableSequenceNumber = incomingCommand -> unreliableSequenceNumber;
             continue;
          }

          if (startCommand != currentCommand)
          {
             enet_list_move (enet_list_end (& peer -> dispatchedCommands), startCommand, enet_list_previous (currentCommand));

             if (! peer -> needsDispatch)
             {
                enet_list_insert (enet_list_end (& peer -> host -> dispatchQueue), & peer -> dispatchList);

                peer -> needsDispatch = 1;
             }

             droppedCommand = currentCommand;
          }
          else
          if (droppedCommand != currentCommand)
            droppedCommand = enet_list_previous (currentCommand);
       }
       else 
       {
          enet_uint16 reliableWindow = incomingCommand -> reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE,
                      currentWindow = channel -> incomingReliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
          if (incomingCommand -> reliableSequenceNumber < channel -> incomingReliableSequenceNumber)
            reliableWindow += ENET_PEER_RELIABLE_WINDOWS;
          if (reliableWindow >= currentWindow && reliableWindow < currentWindow + ENET_PEER_FREE_RELIABLE_WINDOWS - 1)
            break;

          droppedCommand = enet_list_next (currentCommand);

          if (startCommand != currentCommand)
          {
             enet_list_move (enet_list_end (& peer -> dispatchedCommands), startCommand, enet_list_previous (currentCommand));

             if (! peer -> needsDispatch)
             {
                enet_list_insert (enet_list_end (& peer -> host -> dispatchQueue), & peer -> dispatchList);

                peer -> needsDispatch = 1;
             }
          }
       }
          
       startCommand = enet_list_next (currentCommand);
    }

    if (startCommand != currentCommand)
    {
       enet_list_move (enet_list_end (& peer -> dispatchedCommands), startCommand, enet_list_previous (currentCommand));

       if (! peer -> needsDispatch)
       {
           enet_list_insert (enet_list_end (& peer -> host -> dispatchQueue), & peer -> dispatchList);

           peer -> needsDispatch = 1;
       }

       droppedCommand = currentCommand;
    }

    enet_peer_remove_incoming_commands (& channel -> incomingUnreliableCommands, enet_list_begin (& channel -> incomingUnreliableCommands), droppedCommand);
}